

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

bool __thiscall asl::SocketServer::bindPath(SocketServer *this,String *sname)

{
  uint uVar1;
  socklen_t in_ECX;
  undefined4 extraout_EDX;
  int __n;
  undefined4 extraout_var;
  bool bVar2;
  String local_50;
  undefined4 local_38;
  Socket local_28;
  LocalSocket server;
  String *sname_local;
  SocketServer *this_local;
  
  server.super_Socket.super_SmartObject._p = (Socket)(Socket)sname;
  LocalSocket::LocalSocket((LocalSocket *)&local_28);
  uVar1 = Socket::bind(&local_28,(int)server.super_Socket.super_SmartObject._p,
                       (sockaddr *)CONCAT44(extraout_var,extraout_EDX),in_ECX);
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    Socket::listen(&local_28,5,__n);
    Sockets::operator<<(&this->_sockets,&local_28);
  }
  else {
    Socket::errorMsg(&local_50,&local_28);
    asl::String::operator=(&this->_socketError,&local_50);
    asl::String::~String(&local_50);
  }
  local_38 = 1;
  LocalSocket::~LocalSocket((LocalSocket *)&local_28);
  return bVar2;
}

Assistant:

bool SocketServer::bindPath(const String& sname)
{
#if !defined(_WIN32) || defined(ASL_SOCKET_LOCAL)
	LocalSocket server;
	if(server.bind(sname))
	{
		server.listen(5);
		_sockets << server;
		return true;
	}
	_socketError = server.errorMsg();
#else
	(void)sname;
	_socketError = "SOCKET_BAD_BIND";
#endif
	return false;
}